

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O1

int __thiscall
mailManager::listMail
          (mailManager *this,
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map1)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  string temp;
  undefined1 *local_78;
  char *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->map)._M_t);
  local_78 = local_68;
  local_70 = (char *)0x0;
  local_68[0] = 0;
  mailSocket::sendData(this->socket,"stat\r\n");
  pcVar3 = this->recvData;
  mailSocket::recvData(this->socket,pcVar3,0x400);
  mailSocket::sendData(this->socket,"list\r\n");
  mailSocket::recvData(this->socket,pcVar3,0x400);
  pcVar3 = strtok(pcVar3,"\r\n");
  if (pcVar3 != (char *)0x0) {
    pcVar3 = strtok((char *)0x0,"\r\n");
    if (*pcVar3 != '.') {
      iVar4 = 1;
      do {
        pcVar2 = local_70;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)&local_78,0,pcVar2,(ulong)pcVar3);
        local_58._0_4_ = iVar4;
        local_50._M_p = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_78,local_70 + (long)local_78);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<int,std::__cxx11::string>>
                  ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)map1,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_58);
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
        iVar4 = iVar4 + 1;
        pcVar3 = strtok((char *)0x0,"\r\n");
      } while (*pcVar3 != '.');
    }
  }
  sVar1 = (map1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return (int)sVar1;
}

Assistant:

int mailManager::listMail(std::map<int, string> *map1) {
    map.clear();
    string temp;
    char *p;
    int i = 0;

    socket->sendData("stat\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData("list\r\n");
    socket->recvData(recvData, BUF_SIZE);

    p = strtok(recvData, "\r\n");
    while (p) {
        i++;
        p = strtok(nullptr, "\r\n");
        if (*p == '.') {
            break;
        }
        temp = p;
        map1->insert(pair<int, string>(i, temp));
        //TODO 杨旭的任务：这里是得到的列表，使用top能够得到邮件的头部信息，解码存放到map1中
//        socket->sendData("top 1");

    }

    return (int) map1->size();
}